

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod_inv.c
# Opt level: O1

int mod_inv_restore_acc(model_inventory_t *minv,char *accumdir,int mixw_reest,int mean_reest,
                       int var_reest,int tmat_reest,uint32 *veclen)

{
  gauden_t *pgVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint32 n_feat;
  uint32 n_density;
  uint local_1060;
  uint local_105c;
  uint32 n_cb;
  uint32 n_state_pm;
  uint32 n_tmat;
  uint32 n_mixw;
  uint32 *rd_veclen;
  int32 pass2var;
  char fn [4097];
  
  local_1060 = mean_reest;
  local_105c = var_reest;
  if (mixw_reest == 0) {
    iVar4 = 0;
  }
  else {
    ckd_free_3d(minv->mixw_acc);
    minv->mixw_acc = (float32 ***)0x0;
    iVar4 = 0;
    sprintf(fn,"%s/mixw_counts",accumdir);
    iVar2 = s3mixw_read(fn,&minv->mixw_acc,&n_mixw,&n_feat,&n_density);
    if (iVar2 != 0) {
      return -1;
    }
    if (n_mixw != minv->n_mixw) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1cc,"Checkpointed n_mixw=%u inconsistent w/ trainer config=%u\n");
      iVar4 = -1;
    }
    if (n_feat != minv->n_feat) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1d1,"Checkpointed n_feat=%u inconsistent w/ trainer config=%u\n");
      iVar4 = -1;
    }
    if (n_density != minv->n_density) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1d7,"Checkpointed n_density=%u inconsistent w/ trainer config=%u\n");
      iVar4 = -1;
    }
  }
  if (tmat_reest != 0) {
    ckd_free_3d(minv->tmat_acc);
    minv->tmat_acc = (float32 ***)0x0;
    sprintf(fn,"%s/tmat_counts",accumdir);
    iVar2 = s3tmat_read(fn,&minv->tmat_acc,&n_tmat,&n_state_pm);
    if (iVar2 != 0) {
      return -1;
    }
    if (n_tmat != minv->n_tmat) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1e9,"Checkpointed n_tmat=%u inconsistent w/ trainer config=%u\n");
    }
    if (n_state_pm != minv->n_state_pm) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1ed,"Checkpointed n_state_pm=%u inconsistent w/ trainer config=%u\n");
      iVar4 = -1;
    }
  }
  local_105c = local_105c | local_1060;
  iVar2 = iVar4;
  if (local_105c != 0) {
    gauden_free_acc(minv->gauden);
    sprintf(fn,"%s/gauden_counts",accumdir);
    pgVar1 = minv->gauden;
    iVar3 = s3gaucnt_read(fn,&pgVar1->macc,&pgVar1->vacc,&pass2var,&pgVar1->dnom,&n_cb,&n_feat,
                          &n_density,&rd_veclen);
    iVar2 = -1;
    if (iVar3 == 0) {
      iVar2 = iVar4;
      if (n_cb != minv->gauden->n_mgau) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                ,0x203,"Checkpointed n_cb=%u inconsistent w/ trainer config=%u\n");
        iVar2 = -1;
      }
      if (n_feat != minv->n_feat) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                ,0x208,"Checkpointed n_feat=%u inconsistent w/ trainer config=%u\n");
        iVar2 = -1;
      }
      if (n_density != minv->n_density) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                ,0x20d,"Checkpointed n_density=%u inconsistent w/ trainer config=%u\n");
        iVar2 = -1;
      }
      if (n_feat != 0) {
        uVar5 = 0;
        do {
          if (veclen[uVar5] != rd_veclen[uVar5]) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                    ,0x213,
                    "Checkpointed veclen[%u]=%u inconsistent w/ trainer config veclen[%u]=%u\n",
                    uVar5 & 0xffffffff,(ulong)rd_veclen[uVar5],uVar5,(ulong)veclen[uVar5]);
            iVar2 = -1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < n_feat);
      }
      ckd_free(rd_veclen);
    }
  }
  return iVar2;
}

Assistant:

int
mod_inv_restore_acc(model_inventory_t *minv,
		    const char *accumdir,
		    int mixw_reest,
		    int mean_reest,
		    int var_reest,
		    int tmat_reest,
		    const uint32 *veclen)
{
    char fn[MAXPATHLEN+1];
    uint32 n_mixw;
    uint32 n_feat;
    uint32 n_density;

    uint32 n_tmat;
    uint32 n_state_pm;

    uint32 n_cb;
    uint32 *rd_veclen;

    int ret = S3_SUCCESS;

    uint32 i;
    int32 pass2var;
    
    if (mixw_reest) {
	ckd_free_3d((void ***)minv->mixw_acc);
	minv->mixw_acc = NULL;

	sprintf(fn, "%s/mixw_counts", accumdir);
	if (s3mixw_read(fn,
			&minv->mixw_acc,
			&n_mixw,
			&n_feat,
			&n_density) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	if (n_mixw != minv->n_mixw) {
	    E_ERROR("Checkpointed n_mixw=%u inconsistent w/ trainer config=%u\n",
		    n_mixw, minv->n_mixw);
	    ret = S3_ERROR;
	}
	if (n_feat != minv->n_feat) {
	    E_ERROR("Checkpointed n_feat=%u inconsistent w/ trainer config=%u\n",
		    n_feat, minv->n_feat);
	    ret = S3_ERROR;

	}
	if (n_density != minv->n_density) {
	    E_ERROR("Checkpointed n_density=%u inconsistent w/ trainer config=%u\n",
		    n_density, minv->n_density);
	    ret = S3_ERROR;

	}
    }
    if (tmat_reest) {
	ckd_free_3d((void ***)minv->tmat_acc);
	minv->tmat_acc = NULL;

	sprintf(fn, "%s/tmat_counts", accumdir);
	if (s3tmat_read(fn,
			&minv->tmat_acc,
			&n_tmat,
			&n_state_pm) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	if (n_tmat != minv->n_tmat) {
	    E_ERROR("Checkpointed n_tmat=%u inconsistent w/ trainer config=%u\n",
		    n_tmat, minv->n_tmat);
	}
	if (n_state_pm != minv->n_state_pm) {
	    E_ERROR("Checkpointed n_state_pm=%u inconsistent w/ trainer config=%u\n",
		    n_state_pm, minv->n_state_pm);
	    ret = S3_ERROR;
	}
    }
    if (mean_reest || var_reest) {
	gauden_free_acc(minv->gauden);

	sprintf(fn, "%s/gauden_counts", accumdir);

	if (s3gaucnt_read(fn,
			  &(minv->gauden->macc),
			  &(minv->gauden->vacc),
			  &pass2var,
			  &(minv->gauden->dnom),
			  &n_cb,
			  &n_feat,
			  &n_density,
			  &rd_veclen) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	if (n_cb != minv->gauden->n_mgau) {
	    E_ERROR("Checkpointed n_cb=%u inconsistent w/ trainer config=%u\n",
		    n_cb, minv->gauden->n_mgau);
	    ret = S3_ERROR;
	}
	if (n_feat != minv->n_feat) {
	    E_ERROR("Checkpointed n_feat=%u inconsistent w/ trainer config=%u\n",
		    n_feat, minv->n_feat);
	    ret = S3_ERROR;
	}
	if (n_density != minv->n_density) {
	    E_ERROR("Checkpointed n_density=%u inconsistent w/ trainer config=%u\n",
		    n_density, minv->n_density);
	    ret = S3_ERROR;
	}
	for (i = 0; i < n_feat; i++) {
	    if (veclen[i] != rd_veclen[i]) {
		E_ERROR("Checkpointed veclen[%u]=%u inconsistent w/ trainer config veclen[%u]=%u\n",
			i, rd_veclen[i], i, veclen[i]);
		ret = S3_ERROR;
	    }
	}
	ckd_free(rd_veclen);
    }

    return ret;
}